

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O1

bool __thiscall
HookStateStepIn::Start(HookStateStepIn *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  Debugger *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char *pcVar1;
  int iVar2;
  char *__s;
  lua_Debug ar;
  lua_Debug local_480;
  
  this_00 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_01 = (debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  if (current != (lua_State *)0x0) {
    (this->super_StackLevelBasedState).super_HookState.currentStateL = current;
    iVar2 = Debugger::GetStackLevel(this_00,false);
    (this->super_StackLevelBasedState).newStackLevel = iVar2;
    (this->super_StackLevelBasedState).oriStackLevel = iVar2;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (current != (lua_State *)0x0) {
    memset(&local_480,0,0x450);
    (*lua_getstack)(current,0,&local_480);
    (*lua_getinfo)(current,"nSl",&local_480);
    __s = getDebugSource(&local_480);
    pcVar1 = (char *)(this->file)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&this->file,0,pcVar1,(ulong)__s);
    iVar2 = getDebugCurrentLine(&local_480);
    this->line = iVar2;
    Debugger::ExitDebugMode
              ((debugger->super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  return current != (lua_State *)0x0;
}

Assistant:

bool HookStateStepIn::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (!StackLevelBasedState::Start(debugger, current))
		return false;
	lua_Debug ar{};
	lua_getstack(current, 0, &ar);
	lua_getinfo(current, "nSl", &ar);
	file = getDebugSource(&ar);
	line = getDebugCurrentLine(&ar);
	debugger->ExitDebugMode();
	return true;
}